

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

type __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator[]<double>
          (Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,key_type *key)

{
  pointer pcVar1;
  Node *pNVar2;
  value_type *pvVar3;
  unsigned_long uVar4;
  InsertionState IVar5;
  pair<unsigned_long,_robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::InsertionState>
  pVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  pointer local_30;
  
  pVar6 = Table<true,80ul,std::__cxx11::string,double,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::insertKeyPrepareEmptySpot<std::__cxx11::string_const&>
                    ((Table<true,80ul,std::__cxx11::string,double,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                      *)this,key);
  uVar4 = pVar6.first;
  IVar5 = pVar6.second;
  if (IVar5 == overflow_error) {
    throwOverflowError(this);
  }
  else if (IVar5 == new_node) {
    pNVar2 = this->mKeyVals;
    pvVar3 = &pNVar2[uVar4].mData;
    (pvVar3->first)._M_dataplus._M_p = (pointer)&(pvVar3->first).field_2;
    pcVar1 = (key->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pNVar2 + uVar4),pcVar1,pcVar1 + key->_M_string_length);
    pvVar3->second = 0.0;
  }
  else if (IVar5 == overwrite_node) {
    pcVar1 = (key->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + key->_M_string_length);
    local_30 = (pointer)0x0;
    pNVar2 = this->mKeyVals;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pNVar2 + uVar4)
               ,&local_50);
    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pNVar2 + uVar4))[1].
    _M_dataplus._M_p = local_30;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return &this->mKeyVals[uVar4].mData.second;
}

Assistant:

typename std::enable_if<!std::is_void<Q>::value, Q&>::type operator[](const key_type& key) {
        ROBIN_HOOD_TRACE(this)
        auto idxAndState = insertKeyPrepareEmptySpot(key);
        switch (idxAndState.second) {
        case InsertionState::key_found:
            break;

        case InsertionState::new_node:
            ::new (static_cast<void*>(&mKeyVals[idxAndState.first]))
                Node(*this, std::piecewise_construct, std::forward_as_tuple(key),
                     std::forward_as_tuple());
            break;

        case InsertionState::overwrite_node:
            mKeyVals[idxAndState.first] = Node(*this, std::piecewise_construct,
                                               std::forward_as_tuple(key), std::forward_as_tuple());
            break;

        case InsertionState::overflow_error:
            throwOverflowError();
        }

        return mKeyVals[idxAndState.first].getSecond();
    }